

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O1

string * __thiscall Query::as_string_repr_abi_cxx11_(string *__return_storage_ptr__,Query *this)

{
  pointer pQVar1;
  uint64_t uVar2;
  const_iterator __begin1;
  pointer this_00;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  string out;
  _Alloc_hider local_288;
  size_type local_280;
  char local_278;
  undefined7 uStack_277;
  undefined8 uStack_270;
  ulong local_268 [2];
  ulong local_258;
  undefined **local_248;
  undefined1 *local_240;
  long lStack_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  local_288._M_p = &local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
  this_00 = (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
            super__Vector_impl_data._M_start;
  pQVar1 = (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 == pQVar1) {
    local_268[0] = (ulong)(this->ngram).itype;
    local_258 = (ulong)(this->ngram).trigram;
    lStack_238 = 0;
    local_248 = &PTR_grow_00261228;
    local_230 = 500;
    format_str.size_ = 9;
    format_str.data_ = "{}_{:06x}";
    args.field_1.values_ =
         (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)local_268;
    args.types_ = 0x62;
    local_240 = local_228;
    ::fmt::v6::
    vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              ((range)&local_248,format_str,args,(locale_ref)0x0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_240,local_240 + lStack_238);
    local_248 = &PTR_grow_00261228;
    if (local_240 != local_228) {
      operator_delete(local_240,local_230);
    }
  }
  else {
    do {
      uVar2 = QToken::num_possible_values(this_00);
      if (uVar2 == 1) {
        QToken::possible_values(this_00);
        std::__cxx11::string::push_back((char)&local_288);
      }
      else {
        std::__cxx11::string::append((char *)&local_288);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pQVar1);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_288._M_p == &local_278) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_277,local_278);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_270;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_288._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_277,local_278);
    }
    __return_storage_ptr__->_M_string_length = local_280;
    local_280 = 0;
    local_278 = '\0';
    local_288._M_p = &local_278;
  }
  if (local_288._M_p != &local_278) {
    operator_delete(local_288._M_p,CONCAT71(uStack_277,local_278) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Query::as_string_repr() const {
    std::string out = "";
    if (value.empty()) {
        // Query is already after planning stage. Show low-level representation.
        // First digit is the index type and the rest is the raw trigram.
        // Underscore was picked to make copying from terminal easier.
        return fmt::format("{}_{:06x}", (int)ngram.itype, ngram.trigram);
    }
    // No query plan yet. Show stringlike representation.
    for (const auto &token : value) {
        if (token.num_possible_values() == 1) {
            out += token.possible_values()[0];
        } else {
            out += "?";
        }
    }
    return out;
}